

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void pzshape::TPZShapePiram::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long *plVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  TPZFNMatrix<100,_double> *this;
  int xj;
  long lVar15;
  long row;
  int xj_1;
  int64_t local_e68;
  int (*local_e58) [4];
  REAL outval;
  TPZVec<long> ids;
  TPZFMatrix<double> dphin_1;
  TPZManVector<double,_1> outvalvec;
  TPZFMatrix<double> phin_1;
  TPZFNMatrix<40,_double> dphin;
  TPZFNMatrix<40,_double> phin;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  
  pztopology::TPZPyramid::CornerShape((TPZPyramid *)pt,(TPZVec<double> *)phi,dphi,phi);
  bVar7 = true;
  for (lVar11 = 0; lVar11 != 0xe; lVar11 = lVar11 + 1) {
    bVar7 = (bool)(bVar7 & order->fStore[lVar11] < 2);
  }
  if (!bVar7) {
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phiblend,0x13,1);
    this = &dphiblend;
    TPZFNMatrix<100,_double>::TPZFNMatrix(this,3,0x13);
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar1 = *pdVar9;
      this = &phiblend;
      pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar11,0);
      *pdVar9 = dVar1;
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar15,lVar11);
        dVar1 = *pdVar9;
        this = &dphiblend;
        pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar15,lVar11);
        *pdVar9 = dVar1;
      }
    }
    ShapeGenerating((TPZVec<double> *)this,&phiblend.super_TPZFMatrix<double>,
                    &dphiblend.super_TPZFMatrix<double>);
    local_e68 = 5;
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      if (1 < order->fStore[lVar11]) {
        ProjectPoint3dPiramToRib((int)lVar11,pt,&outval);
        TPZVec<long>::TPZVec(&ids,2);
        TPZManVector<double,_1>::TPZManVector(&outvalvec,1,&outval);
        iVar14 = pztopology::TPZPyramid::SideNodes[lVar11][1];
        plVar5 = id->fStore;
        *ids.fStore = plVar5[pztopology::TPZPyramid::SideNodes[lVar11][0]];
        ids.fStore[1] = plVar5[iVar14];
        uVar13 = (long)order->fStore[lVar11] - 1;
        TPZFMatrix<double>::TPZFMatrix(&phin_1,uVar13,1,(double *)&dphin,0x14);
        TPZFMatrix<double>::TPZFMatrix(&dphin_1,3,uVar13,(double *)&phin,0x3c);
        memset(phin_1.fElem,0,
               phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        memset(dphin_1.fElem,0,
               dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        iVar14 = order->fStore[lVar11];
        iVar8 = TPZShapeLinear::GetTransformId1d(&ids);
        TPZShapeLinear::ShapeInternal(&outvalvec.super_TPZVec<double>,iVar14,&phin_1,&dphin_1,iVar8)
        ;
        TransformDerivativeFromRibToPiram((int)lVar11,(int)uVar13,&dphin_1);
        lVar15 = lVar11 + 5;
        local_e68 = (int64_t)(int)local_e68;
        uVar10 = uVar13 & 0xffffffff;
        if ((int)uVar13 < 1) {
          uVar10 = 0;
        }
        for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar15,0);
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar13,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(phi,local_e68,0);
          *pdVar9 = dVar1 * dVar2;
          for (row = 0; row != 3; row = row + 1) {
            pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,row,lVar15);
            dVar1 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar13,0);
            dVar2 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar15,0);
            dVar3 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,row,uVar13);
            dVar4 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(dphi,row,local_e68);
            *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
          }
          local_e68 = local_e68 + 1;
        }
        TPZFMatrix<double>::~TPZFMatrix(&dphin_1);
        TPZFMatrix<double>::~TPZFMatrix(&phin_1);
        TPZManVector<double,_1>::~TPZManVector(&outvalvec);
        TPZVec<long>::~TPZVec(&ids);
      }
    }
    local_e58 = pztopology::TPZPyramid::FaceNodes;
    for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
      if ((1 < order->fStore[uVar10 + 8]) && (uVar10 == 0 || order->fStore[uVar10 + 8] != 2)) {
        TPZManVector<double,_2>::TPZManVector((TPZManVector<double,_2> *)&dphin_1,2);
        ProjectPoint3dPiramToFace((int)uVar10,pt,(TPZVec<double> *)&dphin_1);
        iVar14 = order->fStore[uVar10 | 8];
        if (uVar10 == 0 || 2 < iVar14) {
          if (uVar10 == 0) {
            uVar12 = (iVar14 + -1) * (iVar14 + -1);
          }
          else {
            uVar12 = ((iVar14 + -1) * (iVar14 + -2)) / 2;
          }
          TPZFNMatrix<60,_double>::TPZFNMatrix((TPZFNMatrix<60,_double> *)&phin,(long)(int)uVar12,1)
          ;
          TPZFNMatrix<60,_double>::TPZFNMatrix
                    ((TPZFNMatrix<60,_double> *)&dphin,3,(long)(int)uVar12);
          memset(phin.super_TPZFMatrix<double>.fElem,0,
                 phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8)
          ;
          phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
               '\0';
          memset(dphin.super_TPZFMatrix<double>.fElem,0,
                 dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 CONCAT44(dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                          .fCol._4_4_,
                          (uint)dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                super_TPZBaseMatrix.fCol) * 8);
          dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
               '\0';
          TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)&phin_1,4);
          plVar5 = id->fStore;
          if (uVar10 == 0) {
            for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
              *(long *)(phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar11 * 8) =
                   plVar5[pztopology::TPZPyramid::FaceNodes[0][lVar11]];
            }
          }
          else {
            for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
              *(long *)(phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar11 * 8) =
                   plVar5[(*local_e58)[lVar11]];
            }
          }
          if (uVar10 == 0) {
            iVar8 = TPZShapeQuad::GetTransformId2dQ((TPZVec<long> *)&phin_1);
            TPZShapeQuad::ShapeInternal
                      ((TPZVec<double> *)&dphin_1,iVar14 + -2,(TPZFMatrix<double> *)&phin,
                       (TPZFMatrix<double> *)&dphin,iVar8);
          }
          else {
            TPZManVector<long,_10>::Resize((TPZManVector<long,_10> *)&phin_1,3);
            iVar8 = TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)&phin_1);
            *(double *)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (*(double *)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1.0) * 0.5;
            *(double *)(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) =
                 (*(double *)(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) + 1.0) *
                 0.5;
            TPZShapeTriang::ShapeInternal
                      ((TPZVec<double> *)&dphin_1,iVar14 + -2,(TPZFMatrix<double> *)&phin,
                       (TPZFMatrix<double> *)&dphin,iVar8);
            uVar6 = (uint)dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                          .fCol;
            if ((int)(uint)dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fCol < 1) {
              uVar6 = 0;
            }
            for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
              pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&dphin,0,uVar13);
              *pdVar9 = *pdVar9 * 0.5;
              pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&dphin,1,uVar13);
              *pdVar9 = *pdVar9 * 0.5;
              pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&dphin,2,uVar13);
              *pdVar9 = *pdVar9 * 0.5;
            }
          }
          TransformDerivativeFromFaceToPiram((int)uVar10,uVar12,(TPZFMatrix<double> *)&dphin);
          local_e68 = (int64_t)(int)local_e68;
          lVar11 = uVar10 + 0xd;
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
            pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar11,0);
            dVar1 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&phin,uVar13,0);
            dVar2 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(phi,local_e68,0);
            *pdVar9 = dVar1 * dVar2;
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              pdVar9 = TPZFMatrix<double>::operator()
                                 (&dphiblend.super_TPZFMatrix<double>,lVar15,lVar11);
              dVar1 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&phin,uVar13,0);
              dVar2 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar11,0);
              dVar3 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&dphin,lVar15,uVar13);
              dVar4 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar15,local_e68);
              *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
            }
            local_e68 = local_e68 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&phin_1);
          TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)&dphin);
          TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)&phin);
        }
        TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)&dphin_1);
      }
      local_e58 = local_e58 + 1;
    }
    if (2 < order->fStore[0xd]) {
      uVar12 = 0;
      for (iVar14 = 2; order->fStore[0xd] != iVar14; iVar14 = iVar14 + 1) {
        uVar12 = uVar12 + ((uint)((iVar14 + -1) * iVar14) >> 1);
      }
      uVar10 = (ulong)uVar12;
      TPZFNMatrix<40,_double>::TPZFNMatrix(&phin,uVar10,1);
      TPZFNMatrix<40,_double>::TPZFNMatrix(&dphin,3,uVar10);
      memset(phin.super_TPZFMatrix<double>.fElem,0,
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      memset(dphin.super_TPZFMatrix<double>.fElem,0,
             dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             CONCAT44(dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                      fCol._4_4_,
                      (uint)dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fCol) * 8);
      dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      ShapeInternal(pt,order->fStore[0xd],&phin.super_TPZFMatrix<double>,
                    &dphin.super_TPZFMatrix<double>);
      lVar11 = (long)(int)local_e68;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0x12,0);
        dVar1 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
        dVar2 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
        *pdVar9 = dVar1 * dVar2;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar15,0x12);
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0x12,0);
          dVar3 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&dphin.super_TPZFMatrix<double>,lVar15,uVar13);
          dVar4 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar15,lVar11);
          *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar11 = lVar11 + 1;
      }
      TPZFNMatrix<40,_double>::~TPZFNMatrix(&dphin);
      TPZFNMatrix<40,_double>::~TPZFNMatrix(&phin);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiblend);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phiblend);
  }
  return;
}

Assistant:

void TPZShapePiram::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
        for(is=NCornerNodes; is<NSides; is++){
            if(order[is-NCornerNodes] > 1){
                linear = false;
            }
        }
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[13]<2) return;//order tem as ordens dos lados do elemento
		int shape = 5;
		//rib shapes
		for (int rib = 0; rib < 8; rib++) {//todas as arestas
			if (order[rib] <2 ) continue;
			REAL outval;
			ProjectPoint3dPiramToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPiram(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+5,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+5) * phin( i, 0) +
					phiblend(rib+5, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}

		for (int face = 0; face < 5; face++) {
			if (order[face+8] < 2) continue;
			if(face>0 && order[face+8]<=2) continue;//s� a face 13 tem shape associada com ordem p=2
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dPiramToFace(face,pt,outval);
			int ord1;//,ord2;
			ord1 = order[8+face];
			//ord2 = ord1;
			//FaceOrder(face,ord1,ord2);//ordem da face
			if(face && ord1<3) continue;//uma face com ordem < 3 n�o tem shape associada
			int nshape;
			if(!face) nshape = (ord1-1)*(ord1-1);//face quadrada
			else nshape = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFNMatrix<60> phin(nshape,1),dphin(3,nshape);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2;
			int i;
			if(!face) for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//	id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//	id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			// 	id2 = ShapeFaceId[face][2];//if(face == 0) id3 = ShapeFaceId[face][3];
			int transid;
			if(!face) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(int i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPiram(face,nshape,dphin);//ordin = numero de shapes
			for(i=0;i<nshape;i++)	{
				phi(shape,0) = phiblend(face+13,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+13)* phin(i ,0) +
					phiblend(face+13, 0)*dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[13]<3) return;//n�o h� ordens para cantos
		//volume shapes
		int nshape=0,i;
		for(i=0;i<order[13]-2;i++) {
			nshape += (i+1)*(i+2) / 2;
		}
		TPZFNMatrix<40> phin(nshape,1),dphin(3,nshape);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[13],phin,dphin);
		for(i=0;i<nshape;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}